

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall hypermind::Lexer::Consume(Lexer *this,TokenType type)

{
  TokenType TVar1;
  
  TVar1 = PeekTokenType(this);
  if (TVar1 == type) {
    Consume(this);
    return;
  }
  std::operator<<((ostream *)&std::cout," missing token :  ");
  DumpTokenType((Ostream *)&std::cout,type);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Lexer::Consume(TokenType type) {
        if (PeekTokenType() == type)
            Consume();
        else {
            hm_cout << _HM_C(" missing token :  ");
            DumpTokenType(hm_cout, type);
            hm_cout << std::endl;
        }
    }